

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

bool __thiscall ON_FixedSizePool::ElementIdIsIncreasing(ON_FixedSizePool *this,size_t id_offset)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  size_t delta_i;
  size_t count;
  uint uStack_4c;
  bool bFirstId;
  uint id;
  uint prev_id;
  uint *i1;
  uint *i0;
  char *next_block;
  char *block_end;
  char *block;
  size_t id_offset_local;
  ON_FixedSizePool *this_local;
  
  uStack_4c = 0;
  bVar2 = true;
  if ((this->m_sizeof_element & 3) == 0) {
    if (id_offset < 8) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                 ,0x40b,"","id_offset is too small.");
      this_local._7_1_ = false;
    }
    else if (this->m_sizeof_element < id_offset + 4) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                 ,0x411,"","id_offset is too large.");
      this_local._7_1_ = false;
    }
    else {
      uVar3 = this->m_sizeof_element >> 2;
      block_end = (char *)this->m_first_block;
      while (block_end != (char *)0x0) {
        if (block_end == (char *)this->m_al_block) {
          i0 = (uint *)0x0;
          next_block = (char *)this->m_al_element_array;
        }
        else {
          i0 = *(uint **)block_end;
          next_block = *(char **)(block_end + 8);
        }
        block_end = block_end + 0x10;
        if ((ulong)((long)next_block - (long)block_end) / this->m_sizeof_element != 0) {
          i1 = (uint *)(block_end + id_offset);
          if (bVar2) {
            uStack_4c = *i1;
            bVar2 = false;
            i1 = i1 + uVar3;
          }
          for (; i1 <= next_block + -(this->m_sizeof_element - id_offset); i1 = i1 + uVar3) {
            uVar1 = *i1;
            if (uVar1 <= uStack_4c) {
              return false;
            }
            uStack_4c = uVar1;
          }
        }
        block_end = (char *)i0;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,0x405,"","m_sizeof_element must be a multiple of sizeof(unsigned int).");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_FixedSizePool::ElementIdIsIncreasing(
  size_t id_offset
) const
{
  const char* block;
  const char* block_end;
  const char* next_block;
  const unsigned int* i0;
  const unsigned int* i1;
  unsigned int prev_id = 0;
  unsigned int id;
  bool bFirstId = true;
  size_t count;
  if (0 != ( m_sizeof_element % sizeof(id)) )
  {
    // caller is confused.
    ON_ERROR("m_sizeof_element must be a multiple of sizeof(unsigned int).");
    return false;
  }
  if (id_offset < sizeof(void*) )
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return false;
  }
  if (id_offset + sizeof(prev_id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return false;
  }

  const size_t delta_i = m_sizeof_element / sizeof(id);
  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    count = (block_end - block)/m_sizeof_element;
    if (0 == count)
      continue;

    i0 = ((const unsigned int*)(block + id_offset));
    i1 = ((const unsigned int*)(block_end-(m_sizeof_element-id_offset)));

    if (bFirstId)
    {
      prev_id = *i0;
      bFirstId = false;
      i0 += delta_i;
    }
    while (i0 <= i1)
    {
      id = *i0;
      if (id <= prev_id)
        return false;
      prev_id = id;
      i0 += delta_i;
    }
  }

  return true;
}